

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TSPStateImp.cpp
# Opt level: O2

void __thiscall TSPStateImp::InitData(TSPStateImp *this)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  int i;
  long lVar9;
  double dVar10;
  double dVar11;
  
  std::istream::operator>>((istream *)&std::cin,&this->n);
  uVar8 = (ulong)this->n;
  uVar4 = 0xffffffffffffffff;
  if (-1 < (long)uVar8) {
    uVar4 = uVar8 * 8;
  }
  pdVar3 = (double *)operator_new__(uVar4);
  this->x = pdVar3;
  pdVar3 = (double *)operator_new__(uVar4);
  this->y = pdVar3;
  for (lVar9 = 0; lVar9 < (int)uVar8; lVar9 = lVar9 + 1) {
    std::istream::_M_extract<double>((double *)&std::cin);
    uVar8 = (ulong)(uint)this->n;
  }
  for (lVar9 = 0; iVar7 = (int)uVar8, lVar9 < iVar7; lVar9 = lVar9 + 1) {
    std::istream::_M_extract<double>((double *)&std::cin);
    uVar8 = (ulong)(uint)this->n;
  }
  pdVar3 = (double *)operator_new__((ulong)(uint)(iVar7 * iVar7) << 3);
  this->adjacencyMatrix = pdVar3;
  uVar4 = 0;
  uVar5 = 0;
  if (0 < iVar7) {
    uVar5 = uVar8 & 0xffffffff;
  }
  for (; uVar4 != uVar5; uVar4 = uVar4 + 1) {
    pdVar3 = this->x;
    pdVar1 = this->y;
    iVar7 = this->n;
    pdVar2 = this->adjacencyMatrix;
    for (uVar6 = 0; (uVar8 & 0xffffffff) != uVar6; uVar6 = uVar6 + 1) {
      dVar10 = pdVar3[uVar4] - pdVar3[uVar6];
      dVar11 = pdVar1[uVar4] - pdVar1[uVar6];
      pdVar2[(long)(iVar7 * (int)uVar4) + uVar6] = SQRT(dVar10 * dVar10 + dVar11 * dVar11);
    }
  }
  return;
}

Assistant:

void TSPStateImp::InitData()
{
	std::cin >> n;
	x = new double[n];
	y = new double[n];

	for (int i = 0; i < n; ++i)
		std::cin >> x[i];

	for (int j = 0; j < n; ++j)
		std::cin >> y[j];

	adjacencyMatrix = new double[n * n];

	for (int i = 0; i < n; ++i)
		for (int j = 0; j < n; ++j)
			adjacencyMatrix[i * n + j] = sqrt((x[i] - x[j]) * (x[i] - x[j]) + (y[i] - y[j]) * (y[i] - y[j]));
}